

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFileDaily.cpp
# Opt level: O1

void __thiscall liblogger::LogFileDaily::Rotate(LogFileDaily *this)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  LogException *this_00;
  stringstream ss;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  if ((FILE *)this->m_fp != (FILE *)0x0) {
    iVar1 = fclose((FILE *)this->m_fp);
    if (iVar1 < 0) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>(local_190,"Cannot close file: \'",0x14);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_190,(this->m_fname)._M_dataplus._M_p,
                          (this->m_fname)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' error: ",9);
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      std::operator<<(poVar2,pcVar4);
      this_00 = (LogException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LogException::LogException(this_00,&local_1c0);
      __cxa_throw(this_00,&LogException::typeinfo,LogException::~LogException);
    }
    this->m_fp = (FILE *)0x0;
  }
  RemoveOld(this);
  return;
}

Assistant:

void LogFileDaily::Rotate()
{
	if (m_fp != NULL)
	{
		if (fclose(m_fp) < 0)
		{
			std::stringstream ss;
			ss << "Cannot close file: '" << m_fname << "' error: " << strerror(errno);
			throw(LogException(ss.str()));
		}
		m_fp = NULL;
	}
	RemoveOld();
}